

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

bool __thiscall ON_Line::IsFartherThan(ON_Line *this,double d,ON_3dPoint *P)

{
  double dVar1;
  ON_3dPoint *P_local;
  double d_local;
  ON_Line *this_local;
  
  if ((P->x <= (this->to).x + d) || (P->x <= (this->from).x + d)) {
    if (((this->to).x - d <= P->x) || ((this->from).x - d <= P->x)) {
      if ((P->y <= (this->to).y + d) || (P->y <= (this->from).y + d)) {
        if (((this->to).y - d <= P->y) || ((this->from).y - d <= P->y)) {
          if ((P->z <= (this->to).z + d) || (P->z <= (this->from).z + d)) {
            if (((this->to).z - d <= P->z) || ((this->from).z - d <= P->z)) {
              dVar1 = MinimumDistanceTo(this,P);
              this_local._7_1_ = d < dVar1;
            }
            else {
              this_local._7_1_ = true;
            }
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Line::IsFartherThan( double d, const ON_3dPoint& P ) const
{
  if ( P.x > to.x+d && P.x > from.x+d )
  {
    return true;
  }
  if ( P.x < to.x-d && P.x < from.x-d )
  {
    return true;
  }
  if ( P.y > to.y+d && P.y > from.y+d )
  {
    return true;
  }
  if ( P.y < to.y-d && P.y < from.y-d )
  {
    return true;
  }
  if ( P.z > to.z+d && P.z > from.z+d )
  {
    return true;
  }
  if ( P.z < to.z-d && P.z < from.z-d )
  {
    return true;
  }
  return (MinimumDistanceTo(P) > d);
}